

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.c
# Opt level: O2

rtree_leaf_elm_t *
duckdb_je_rtree_leaf_elm_lookup_hard
          (tsdn_t *tsdn,rtree_t *rtree,rtree_ctx_t *rtree_ctx,uintptr_t key,_Bool dependent,
          _Bool init_missing)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  undefined3 in_register_00000089;
  uint uVar7;
  
  uVar5 = (uint)(key >> 0x1e);
  uVar7 = uVar5 & 0x3ffff;
  if (CONCAT31(in_register_00000089,init_missing) == 0) {
    if (!dependent) {
      pvVar4 = rtree->root[uVar7].child.repr;
      goto LAB_00e77562;
    }
  }
  else if (!dependent) {
    pvVar4 = rtree->root[uVar7].child.repr;
    if (pvVar4 == (void *)0x0) {
      __mutex = (pthread_mutex_t *)((long)&(rtree->init_lock).field_0 + 0x48);
      iVar3 = pthread_mutex_trylock(__mutex);
      if (iVar3 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&rtree->init_lock);
        (rtree->init_lock).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(rtree->init_lock).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if ((rtree->init_lock).field_0.field_0.prof_data.prev_owner != tsdn) {
        (rtree->init_lock).field_0.field_0.prof_data.prev_owner = tsdn;
        ppwVar2 = &(rtree->init_lock).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      pvVar4 = rtree->root[uVar7].child.repr;
      if (pvVar4 == (void *)0x0) {
        pvVar4 = duckdb_je_base_alloc_rtree(tsdn,rtree->base,0x200000);
        if (pvVar4 == (void *)0x0) {
          pvVar4 = (void *)0x0;
        }
        else {
          rtree->root[uVar7].child.repr = pvVar4;
        }
      }
      (rtree->init_lock).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
    }
LAB_00e77562:
    if (pvVar4 == (void *)0x0) {
      return (rtree_leaf_elm_t *)0x0;
    }
    goto LAB_00e77567;
  }
  pvVar4 = rtree->root[uVar7].child.repr;
LAB_00e77567:
  memmove(rtree_ctx->l2_cache + 1,rtree_ctx->l2_cache,0x70);
  uVar6 = (ulong)((uVar5 & 0xf) << 4);
  rtree_ctx->l2_cache[0].leafkey = *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar6);
  rtree_ctx->l2_cache[0].leaf = *(rtree_leaf_elm_t **)((long)&rtree_ctx->cache[0].leaf + uVar6);
  *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar6) = key & 0xffffffffc0000000;
  *(void **)((long)&rtree_ctx->cache[0].leaf + uVar6) = pvVar4;
  return (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + (long)pvVar4);
}

Assistant:

rtree_leaf_elm_t *
rtree_leaf_elm_lookup_hard(tsdn_t *tsdn, rtree_t *rtree, rtree_ctx_t *rtree_ctx,
    uintptr_t key, bool dependent, bool init_missing) {
	rtree_node_elm_t *node;
	rtree_leaf_elm_t *leaf;
#if RTREE_HEIGHT > 1
	node = rtree->root;
#else
	leaf = rtree->root;
#endif

	if (config_debug) {
		uintptr_t leafkey = rtree_leafkey(key);
		for (unsigned i = 0; i < RTREE_CTX_NCACHE; i++) {
			assert(rtree_ctx->cache[i].leafkey != leafkey);
		}
		for (unsigned i = 0; i < RTREE_CTX_NCACHE_L2; i++) {
			assert(rtree_ctx->l2_cache[i].leafkey != leafkey);
		}
	}

#define RTREE_GET_CHILD(level) {					\
		assert(level < RTREE_HEIGHT-1);				\
		if (level != 0 && !dependent &&				\
		    unlikely(!rtree_node_valid(node))) {		\
			return NULL;					\
		}							\
		uintptr_t subkey = rtree_subkey(key, level);		\
		if (level + 2 < RTREE_HEIGHT) {				\
			node = init_missing ?				\
			    rtree_child_node_read(tsdn, rtree,		\
			    &node[subkey], level, dependent) :		\
			    rtree_child_node_tryread(&node[subkey],	\
			    dependent);					\
		} else {						\
			leaf = init_missing ?				\
			    rtree_child_leaf_read(tsdn, rtree,		\
			    &node[subkey], level, dependent) :		\
			    rtree_child_leaf_tryread(&node[subkey],	\
			    dependent);					\
		}							\
	}
	/*
	 * Cache replacement upon hard lookup (i.e. L1 & L2 rtree cache miss):
	 * (1) evict last entry in L2 cache; (2) move the collision slot from L1
	 * cache down to L2; and 3) fill L1.
	 */
#define RTREE_GET_LEAF(level) {						\
		assert(level == RTREE_HEIGHT-1);			\
		if (!dependent && unlikely(!rtree_leaf_valid(leaf))) {	\
			return NULL;					\
		}							\
		if (RTREE_CTX_NCACHE_L2 > 1) {				\
			memmove(&rtree_ctx->l2_cache[1],		\
			    &rtree_ctx->l2_cache[0],			\
			    sizeof(rtree_ctx_cache_elm_t) *		\
			    (RTREE_CTX_NCACHE_L2 - 1));			\
		}							\
		size_t slot = rtree_cache_direct_map(key);		\
		rtree_ctx->l2_cache[0].leafkey =			\
		    rtree_ctx->cache[slot].leafkey;			\
		rtree_ctx->l2_cache[0].leaf =				\
		    rtree_ctx->cache[slot].leaf;			\
		uintptr_t leafkey = rtree_leafkey(key);			\
		rtree_ctx->cache[slot].leafkey = leafkey;		\
		rtree_ctx->cache[slot].leaf = leaf;			\
		uintptr_t subkey = rtree_subkey(key, level);		\
		return &leaf[subkey];					\
	}
	if (RTREE_HEIGHT > 1) {
		RTREE_GET_CHILD(0)
	}
	if (RTREE_HEIGHT > 2) {
		RTREE_GET_CHILD(1)
	}
	if (RTREE_HEIGHT > 3) {
		for (unsigned i = 2; i < RTREE_HEIGHT-1; i++) {
			RTREE_GET_CHILD(i)
		}
	}
	RTREE_GET_LEAF(RTREE_HEIGHT-1)
#undef RTREE_GET_CHILD
#undef RTREE_GET_LEAF
	not_reached();
}